

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O2

void Abc_NtkSplitLarge(Abc_Ntk_t *pNtk,int nFaninsMax,int nCubesMax)

{
  int iVar1;
  int iVar2;
  Abc_Obj_t *pNode;
  int i;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                  ,0x1a8,"void Abc_NtkSplitLarge(Abc_Ntk_t *, int, int)");
  }
  iVar1 = pNtk->vObjs->nSize;
  i = 0;
  iVar2 = iVar1;
  do {
    if (iVar2 <= i) {
      return;
    }
    pNode = Abc_NtkObj(pNtk,i);
    if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
      if (iVar1 == i) {
        return;
      }
      iVar2 = Abc_SopGetCubeNum((char *)(pNode->field_5).pData);
      if (nCubesMax < iVar2 || 1 < iVar2 && nFaninsMax < (pNode->vFanins).nSize) {
        Abc_NodeSplitLarge(pNode);
      }
    }
    i = i + 1;
    iVar2 = pNtk->vObjs->nSize;
  } while( true );
}

Assistant:

void Abc_NtkSplitLarge( Abc_Ntk_t * pNtk, int nFaninsMax, int nCubesMax )
{
    Abc_Obj_t * pNode;
    int nObjOld = Abc_NtkObjNumMax(pNtk);
    int i, nCubes;
    assert( Abc_NtkHasSop(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( i == nObjOld )
            break;
        nCubes = Abc_SopGetCubeNum((char *)pNode->pData);
        if ( (Abc_ObjFaninNum(pNode) > nFaninsMax && nCubes > 1) || nCubes > nCubesMax )
            Abc_NodeSplitLarge( pNode );
    }
}